

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufBackToBuffer(xmlBufPtr buf,xmlBufferPtr ret)

{
  uint uVar1;
  
  if (ret == (xmlBufferPtr)0x0 || buf == (xmlBufPtr)0x0) {
    return -1;
  }
  if ((buf->flags & 7) == 0) {
    if (buf->use < 0x7fffffff) {
      ret->use = (uint)buf->use;
      uVar1 = 0x7fffffff;
      if (buf->size < 0x7fffffff) {
        uVar1 = (int)buf->size + 1;
      }
      ret->size = uVar1;
      ret->alloc = XML_BUFFER_ALLOC_IO;
      ret->content = buf->content;
      ret->contentIO = buf->mem;
      (*xmlFree)(buf);
      return 0;
    }
  }
  else if ((buf->flags & 4) != 0) goto LAB_0012acdf;
  (*xmlFree)(buf->mem);
LAB_0012acdf:
  (*xmlFree)(buf);
  ret->contentIO = (xmlChar *)0x0;
  ret->content = (xmlChar *)0x0;
  ret->use = 0;
  ret->size = 0;
  return -1;
}

Assistant:

int
xmlBufBackToBuffer(xmlBufPtr buf, xmlBufferPtr ret) {
    if ((buf == NULL) || (ret == NULL))
        return(-1);

    if ((BUF_ERROR(buf)) || (BUF_STATIC(buf)) ||
        (buf->use >= INT_MAX)) {
        xmlBufFree(buf);
        ret->content = NULL;
        ret->contentIO = NULL;
        ret->use = 0;
        ret->size = 0;
        return(-1);
    }

    ret->use = buf->use;
    if (buf->size >= INT_MAX) {
        /* Keep the buffer but provide a truncated size value. */
        ret->size = INT_MAX;
    } else {
        ret->size = buf->size + 1;
    }
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->content = buf->content;
    ret->contentIO = buf->mem;
    xmlFree(buf);
    return(0);
}